

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O0

void * aom_malloc(size_t size)

{
  void *pvVar1;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  
  pvVar1 = aom_memalign(in_stack_00000018,in_stack_00000010);
  return pvVar1;
}

Assistant:

void *aom_malloc(size_t size) { return aom_memalign(DEFAULT_ALIGNMENT, size); }